

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.h
# Opt level: O0

int pybind11::detail::
    process_attributes<pybind11::name,_pybind11::is_method,_pybind11::sibling,_pybind11::arg_v,_pybind11::arg_v,_pybind11::arg_v,_pybind11::arg_v,_pybind11::arg_v,_pybind11::arg_v,_pybind11::arg_v,_pybind11::arg_v,_pybind11::arg_v>
    ::init(EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  process_attribute<pybind11::arg_v,_void> *in_RCX;
  process_attribute<pybind11::sibling,_void> *in_RDX;
  process_attribute<pybind11::is_method,_void> *in_RSI;
  process_attribute<pybind11::arg_v,_void> *in_R8;
  process_attribute<pybind11::arg_v,_void> *in_R9;
  int unused [13];
  EVP_PKEY_CTX *in_stack_00000038;
  int local_68 [14];
  process_attribute<pybind11::arg_v,_void> *local_30;
  process_attribute<pybind11::arg_v,_void> *local_28;
  process_attribute<pybind11::arg_v,_void> *local_20;
  process_attribute<pybind11::sibling,_void> *local_18;
  process_attribute<pybind11::is_method,_void> *local_10;
  EVP_PKEY_CTX *local_8;
  
  local_68[0] = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = ctx;
  process_attribute<pybind11::name,_void>::init
            ((process_attribute<pybind11::name,_void> *)ctx,in_stack_00000038);
  local_68[1] = 0;
  process_attribute<pybind11::is_method,_void>::init(local_10,in_stack_00000038);
  local_68[2] = 0;
  process_attribute<pybind11::sibling,_void>::init(local_18,in_stack_00000038);
  local_68[3] = 0;
  process_attribute<pybind11::arg_v,_void>::init(local_20,in_stack_00000038);
  local_68[4] = 0;
  process_attribute<pybind11::arg_v,_void>::init(local_28,in_stack_00000038);
  local_68[5] = 0;
  process_attribute<pybind11::arg_v,_void>::init(local_30,in_stack_00000038);
  local_68[6] = 0;
  process_attribute<pybind11::arg_v,_void>::init
            ((process_attribute<pybind11::arg_v,_void> *)unused._8_8_,in_stack_00000038);
  local_68[7] = 0;
  process_attribute<pybind11::arg_v,_void>::init
            ((process_attribute<pybind11::arg_v,_void> *)unused._16_8_,in_stack_00000038);
  local_68[8] = 0;
  process_attribute<pybind11::arg_v,_void>::init
            ((process_attribute<pybind11::arg_v,_void> *)unused._24_8_,in_stack_00000038);
  local_68[9] = 0;
  process_attribute<pybind11::arg_v,_void>::init
            ((process_attribute<pybind11::arg_v,_void> *)unused._32_8_,in_stack_00000038);
  local_68[10] = 0;
  process_attribute<pybind11::arg_v,_void>::init
            ((process_attribute<pybind11::arg_v,_void> *)unused._40_8_,in_stack_00000038);
  local_68[0xb] = 0;
  process_attribute<pybind11::arg_v,_void>::init(stack0x00000030,in_stack_00000038);
  local_68[0xc] = 0;
  ignore_unused(local_68);
  return extraout_EAX;
}

Assistant:

static void init(const Args&... args, function_record *r) {
        int unused[] = { 0, (process_attribute<typename std::decay<Args>::type>::init(args, r), 0) ... };
        ignore_unused(unused);
    }